

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void __thiscall ImGuiWindow::ImGuiWindow(ImGuiWindow *this,ImGuiContext *context,char *name)

{
  ImU32 IVar1;
  ImGuiID IVar2;
  char *pcVar3;
  size_t sVar4;
  
  *(undefined8 *)((long)&(this->WindowClass).ViewportFlagsOverrideSet + 1) = 0;
  *(undefined8 *)((long)&(this->WindowClass).DockNodeFlagsOverrideSet + 1) = 0;
  (this->WindowClass).ClassId = 0;
  (this->WindowClass).ParentViewportId = 0;
  (this->WindowClass).ViewportFlagsOverrideSet = 0;
  (this->WindowClass).ViewportFlagsOverrideClear = 0;
  (this->WindowClass).DockingAllowUnclassed = true;
  (this->ViewportPos).x = 0.0;
  (this->ViewportPos).y = 0.0;
  (this->IDStack).Size = 0;
  (this->IDStack).Capacity = 0;
  (this->IDStack).Data = (uint *)0x0;
  (this->Pos).x = 0.0;
  (this->Pos).y = 0.0;
  (this->Size).x = 0.0;
  (this->Size).y = 0.0;
  (this->SizeFull).x = 0.0;
  (this->SizeFull).y = 0.0;
  (this->ContentSize).x = 0.0;
  (this->ContentSize).y = 0.0;
  (this->ContentSizeExplicit).x = 0.0;
  (this->ContentSizeExplicit).y = 0.0;
  (this->WindowPadding).x = 0.0;
  (this->WindowPadding).y = 0.0;
  (this->Scroll).x = 0.0;
  (this->Scroll).y = 0.0;
  (this->ScrollMax).x = 0.0;
  (this->ScrollMax).y = 0.0;
  (this->ScrollTarget).x = 0.0;
  (this->ScrollTarget).y = 0.0;
  (this->ScrollTargetCenterRatio).x = 0.0;
  (this->ScrollTargetCenterRatio).y = 0.0;
  (this->ScrollTargetEdgeSnapDist).x = 0.0;
  (this->ScrollTargetEdgeSnapDist).y = 0.0;
  (this->ScrollbarSizes).x = 0.0;
  (this->ScrollbarSizes).y = 0.0;
  (this->SetWindowPosVal).x = 0.0;
  (this->SetWindowPosVal).y = 0.0;
  (this->SetWindowPosPivot).x = 0.0;
  (this->SetWindowPosPivot).y = 0.0;
  ImGuiWindowTempData::ImGuiWindowTempData(&this->DC);
  (this->ContentRegionRect).Min.x = 0.0;
  (this->ContentRegionRect).Min.y = 0.0;
  (this->ContentRegionRect).Max.x = 0.0;
  (this->ContentRegionRect).Max.y = 0.0;
  (this->ClipRect).Min.x = 0.0;
  (this->ClipRect).Min.y = 0.0;
  (this->ClipRect).Max.x = 0.0;
  (this->ClipRect).Max.y = 0.0;
  (this->ParentWorkRect).Min.x = 0.0;
  (this->ParentWorkRect).Min.y = 0.0;
  (this->ParentWorkRect).Max.x = 0.0;
  (this->ParentWorkRect).Max.y = 0.0;
  (this->WorkRect).Min.x = 0.0;
  (this->WorkRect).Min.y = 0.0;
  (this->WorkRect).Max.x = 0.0;
  (this->WorkRect).Max.y = 0.0;
  (this->InnerClipRect).Min.x = 0.0;
  (this->InnerClipRect).Min.y = 0.0;
  (this->InnerClipRect).Max.x = 0.0;
  (this->InnerClipRect).Max.y = 0.0;
  (this->HitTestHoleSize).x = 0;
  (this->HitTestHoleSize).y = 0;
  (this->HitTestHoleOffset).x = 0;
  (this->HitTestHoleOffset).y = 0;
  (this->InnerRect).Min.x = 0.0;
  (this->InnerRect).Min.y = 0.0;
  (this->InnerRect).Max.x = 0.0;
  (this->InnerRect).Max.y = 0.0;
  (this->OuterRectClipped).Min.x = 0.0;
  (this->OuterRectClipped).Min.y = 0.0;
  (this->OuterRectClipped).Max.x = 0.0;
  (this->OuterRectClipped).Max.y = 0.0;
  (this->StateStorage).Data.Size = 0;
  (this->StateStorage).Data.Capacity = 0;
  (this->StateStorage).Data.Data = (ImGuiStoragePair *)0x0;
  (this->ColumnsStorage).Size = 0;
  (this->ColumnsStorage).Capacity = 0;
  (this->ColumnsStorage).Data = (ImGuiColumns *)0x0;
  ImDrawList::ImDrawList(&this->DrawListInst,&context->DrawListSharedData);
  this->NavRectRel[1].Min.x = 0.0;
  this->NavRectRel[1].Min.y = 0.0;
  this->NavRectRel[1].Max.x = 0.0;
  this->NavRectRel[1].Max.y = 0.0;
  this->NavRectRel[0].Min.x = 0.0;
  this->NavRectRel[0].Min.y = 0.0;
  this->NavRectRel[0].Max.x = 0.0;
  this->NavRectRel[0].Max.y = 0.0;
  (this->DockTabItemRect).Min.x = 0.0;
  (this->DockTabItemRect).Min.y = 0.0;
  (this->DockTabItemRect).Max.x = 0.0;
  (this->DockTabItemRect).Max.y = 0.0;
  pcVar3 = ImStrdup(name);
  this->Name = pcVar3;
  IVar1 = ImHashStr(name,0,0);
  this->ID = IVar1;
  ImVector<unsigned_int>::push_back(&this->IDStack,&this->ID);
  this->Flags = 0;
  this->FlagsPreviousFrame = 0;
  this->Viewport = (ImGuiViewportP *)0x0;
  this->ViewportId = 0;
  (this->ViewportPos).x = 3.4028235e+38;
  *(undefined8 *)&(this->ViewportPos).y = 0xffffffff7f7fffff;
  (this->ContentSizeExplicit).x = 0.0;
  (this->ContentSizeExplicit).y = 0.0;
  (this->WindowPadding).x = 0.0;
  (this->WindowPadding).y = 0.0;
  (this->SizeFull).x = 0.0;
  (this->SizeFull).y = 0.0;
  (this->ContentSize).x = 0.0;
  (this->ContentSize).y = 0.0;
  (this->Pos).x = 0.0;
  (this->Pos).y = 0.0;
  (this->Size).x = 0.0;
  (this->Size).y = 0.0;
  this->WindowRounding = 0.0;
  this->WindowBorderSize = 0.0;
  sVar4 = strlen(name);
  this->NameBufLen = (int)sVar4 + 1;
  IVar2 = GetID(this,"#MOVE",(char *)0x0);
  this->MoveId = IVar2;
  this->ChildId = 0;
  (this->Scroll).x = 0.0;
  (this->Scroll).y = 0.0;
  (this->ScrollTarget).x = 3.4028235e+38;
  (this->ScrollTarget).y = 3.4028235e+38;
  (this->ScrollTargetCenterRatio).x = 0.5;
  (this->ScrollTargetCenterRatio).y = 0.5;
  (this->ScrollbarSizes).x = 0.0;
  (this->ScrollbarSizes).y = 0.0;
  this->ScrollbarX = false;
  this->ScrollbarY = false;
  this->ViewportOwned = false;
  this->Active = false;
  this->WasActive = false;
  this->WriteAccessed = false;
  this->Collapsed = false;
  this->WantCollapseToggle = false;
  this->WriteAccessed = false;
  this->Collapsed = false;
  this->WantCollapseToggle = false;
  this->SkipItems = false;
  this->Appearing = false;
  this->Hidden = false;
  this->IsFallbackWindow = false;
  this->HasCloseButton = false;
  this->ResizeBorderHeld = -1;
  this->BeginCount = 0;
  this->BeginOrderWithinParent = -1;
  this->BeginOrderWithinContext = -1;
  this->PopupId = 0;
  this->AutoFitFramesX = -1;
  this->AutoFitFramesY = -1;
  this->AutoFitChildAxises = '\0';
  this->AutoFitOnlyGrows = false;
  this->AutoPosLastDirection = -1;
  this->HiddenFramesCanSkipItems = 0;
  this->HiddenFramesCannotSkipItems = 0;
  this->SetWindowPosAllowFlags = 0xf;
  (this->SetWindowPosPivot).y = 3.4028235e+38;
  this->SetWindowSizeAllowFlags = 0xf;
  this->SetWindowCollapsedAllowFlags = 0xf;
  this->SetWindowDockAllowFlags = 0xf;
  (this->SetWindowPosVal).x = 3.4028235e+38;
  *(undefined8 *)&(this->SetWindowPosVal).y = 0x7f7fffff7f7fffff;
  (this->InnerRect).Min.x = 0.0;
  (this->InnerRect).Min.y = 0.0;
  (this->InnerRect).Max.x = 0.0;
  (this->InnerRect).Max.y = 0.0;
  this->LastFrameActive = -1;
  this->LastFrameJustFocused = -1;
  this->LastTimeActive = -1.0;
  this->ItemWidthDefault = 0.0;
  this->FontWindowScale = 1.0;
  this->FontDpiScale = 1.0;
  this->SettingsOffset = -1;
  this->DrawList = &this->DrawListInst;
  (this->DrawListInst)._OwnerName = this->Name;
  this->NavLastIds[0] = 0;
  this->NavLastIds[1] = 0;
  this->ParentWindow = (ImGuiWindow *)0x0;
  this->RootWindow = (ImGuiWindow *)0x0;
  this->RootWindowDockStop = (ImGuiWindow *)0x0;
  this->RootWindowForTitleBarHighlight = (ImGuiWindow *)0x0;
  this->RootWindowForNav = (ImGuiWindow *)0x0;
  this->NavRectRel[1].Min.x = 0.0;
  this->NavRectRel[1].Min.y = 0.0;
  this->NavRectRel[1].Max.x = 0.0;
  this->NavRectRel[1].Max.y = 0.0;
  this->NavRectRel[0].Min.x = 0.0;
  this->NavRectRel[0].Min.y = 0.0;
  this->NavRectRel[0].Max.x = 0.0;
  this->NavRectRel[0].Max.y = 0.0;
  this->NavLastChildNavWindow = (ImGuiWindow *)0x0;
  this->MemoryCompacted = false;
  this->MemoryDrawListIdxCapacity = 0;
  this->MemoryDrawListVtxCapacity = 0;
  this->DockId = 0;
  this->DockTabItemStatusFlags = 0;
  this->DockNode = (ImGuiDockNode *)0x0;
  this->DockNodeAsHost = (ImGuiDockNode *)0x0;
  this->DockOrder = -1;
  this->field_0x492 = this->field_0x492 & 0xf8;
  return;
}

Assistant:

ImGuiWindow::ImGuiWindow(ImGuiContext* context, const char* name)
    : DrawListInst(&context->DrawListSharedData)
{
    Name = ImStrdup(name);
    ID = ImHashStr(name);
    IDStack.push_back(ID);
    Flags = FlagsPreviousFrame = ImGuiWindowFlags_None;
    Viewport = NULL;
    ViewportId = 0;
    ViewportAllowPlatformMonitorExtend = -1;
    ViewportPos = ImVec2(FLT_MAX, FLT_MAX);
    Pos = ImVec2(0.0f, 0.0f);
    Size = SizeFull = ImVec2(0.0f, 0.0f);
    ContentSize = ContentSizeExplicit = ImVec2(0.0f, 0.0f);
    WindowPadding = ImVec2(0.0f, 0.0f);
    WindowRounding = 0.0f;
    WindowBorderSize = 0.0f;
    NameBufLen = (int)strlen(name) + 1;
    MoveId = GetID("#MOVE");
    ChildId = 0;
    Scroll = ImVec2(0.0f, 0.0f);
    ScrollTarget = ImVec2(FLT_MAX, FLT_MAX);
    ScrollTargetCenterRatio = ImVec2(0.5f, 0.5f);
    ScrollbarSizes = ImVec2(0.0f, 0.0f);
    ScrollbarX = ScrollbarY = false;
    ViewportOwned = false;
    Active = WasActive = false;
    WriteAccessed = false;
    Collapsed = false;
    WantCollapseToggle = false;
    SkipItems = false;
    Appearing = false;
    Hidden = false;
    IsFallbackWindow = false;
    HasCloseButton = false;
    ResizeBorderHeld = -1;
    BeginCount = 0;
    BeginOrderWithinParent = -1;
    BeginOrderWithinContext = -1;
    PopupId = 0;
    AutoFitFramesX = AutoFitFramesY = -1;
    AutoFitChildAxises = 0x00;
    AutoFitOnlyGrows = false;
    AutoPosLastDirection = ImGuiDir_None;
    HiddenFramesCanSkipItems = HiddenFramesCannotSkipItems = 0;
    SetWindowPosAllowFlags = SetWindowSizeAllowFlags = SetWindowCollapsedAllowFlags = SetWindowDockAllowFlags = ImGuiCond_Always | ImGuiCond_Once | ImGuiCond_FirstUseEver | ImGuiCond_Appearing;
    SetWindowPosVal = SetWindowPosPivot = ImVec2(FLT_MAX, FLT_MAX);

    InnerRect = ImRect(0.0f, 0.0f, 0.0f, 0.0f); // Clear so the InnerRect.GetSize() code in Begin() doesn't lead to overflow even if the result isn't used.

    LastFrameActive = -1;
    LastFrameJustFocused = -1;
    LastTimeActive = -1.0f;
    ItemWidthDefault = 0.0f;
    FontWindowScale = FontDpiScale = 1.0f;
    SettingsOffset = -1;

    DrawList = &DrawListInst;
    DrawList->_OwnerName = Name;
    ParentWindow = NULL;
    RootWindow = NULL;
    RootWindowDockStop = NULL;
    RootWindowForTitleBarHighlight = NULL;
    RootWindowForNav = NULL;

    NavLastIds[0] = NavLastIds[1] = 0;
    NavRectRel[0] = NavRectRel[1] = ImRect();
    NavLastChildNavWindow = NULL;

    MemoryCompacted = false;
    MemoryDrawListIdxCapacity = MemoryDrawListVtxCapacity = 0;

    DockNode = DockNodeAsHost = NULL;
    DockId = 0;
    DockTabItemStatusFlags = ImGuiItemStatusFlags_None;
    DockOrder = -1;
    DockIsActive = DockTabIsVisible = DockTabWantClose = false;
}